

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O3

void tcg_out_setcond64(TCGContext_conflict9 *s,TCGCond cond,TCGArg dest,TCGArg arg1,TCGArg arg2,
                      int const_arg2)

{
  tcg_insn_unit *ptVar1;
  byte *pbVar2;
  byte bVar3;
  int rm;
  
  tcg_out_cmp(s,arg1,arg2,const_arg2,0x1000);
  rm = (int)dest;
  tcg_out_opc(s,""[cond] | 0x4190,0,rm,0);
  bVar3 = (byte)dest & 7;
  ptVar1 = s->code_ptr;
  s->code_ptr = ptVar1 + 1;
  *ptVar1 = bVar3 - 0x40;
  tcg_out_opc(s,0x41b6,rm,rm,0);
  pbVar2 = s->code_ptr;
  s->code_ptr = pbVar2 + 1;
  *pbVar2 = bVar3 + (byte)dest * '\b' | 0xc0;
  return;
}

Assistant:

static void tcg_out_setcond64(TCGContext *s, TCGCond cond, TCGArg dest,
                              TCGArg arg1, TCGArg arg2, int const_arg2)
{
    tcg_out_cmp(s, arg1, arg2, const_arg2, P_REXW);
    tcg_out_modrm(s, OPC_SETCC | tcg_cond_to_jcc[cond], 0, dest);
    tcg_out_ext8u(s, dest, dest);
}